

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O2

void vkt::api::anon_unknown_0::addImageToImageAllFormatsDepthStencilFormatsTests
               (TestCaseGroup *group,TestParams *params)

{
  TestContext *testCtx;
  CopyImageToImageTestCase *this;
  long lVar1;
  long lVar2;
  VkImageLayout layout;
  VkImageLayout layout_00;
  VkImageLayout layout_01;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  string testName;
  string description;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  TestParams local_80;
  
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    (params->src).image.operationLayout = (&DAT_00971ee8)[lVar1];
    lVar2 = 0;
    while( true ) {
      if (lVar2 == 8) break;
      (params->dst).image.operationLayout = *(VkImageLayout *)((long)&DAT_00971ef0 + lVar2);
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_120,(_anonymous_namespace_ *)(ulong)(params->src).image.operationLayout,
                 (VkImageLayout)in_RDX);
      std::operator+(&local_c0,&local_120,"_");
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_140,(_anonymous_namespace_ *)(ulong)(params->dst).image.operationLayout,
                 layout);
      std::operator+(&local_100,&local_c0,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_120);
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_e0,(_anonymous_namespace_ *)(ulong)(params->src).image.operationLayout,
                 layout_00);
      std::operator+(&local_140,"From layout ",&local_e0);
      std::operator+(&local_120,&local_140," to ");
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_a0,(_anonymous_namespace_ *)(ulong)(params->dst).image.operationLayout,
                 layout_01);
      std::operator+(&local_c0,&local_120,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_e0);
      this = (CopyImageToImageTestCase *)operator_new(0xc0);
      testCtx = (group->super_TestNode).m_testCtx;
      TestParams::TestParams(&local_80,params);
      CopyImageToImageTestCase::CopyImageToImageTestCase
                (this,testCtx,&local_100,&local_c0,&local_80);
      tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)this);
      TestParams::~TestParams(&local_80);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_100);
      lVar2 = lVar2 + 4;
      in_RDX = extraout_RDX;
    }
  }
  return;
}

Assistant:

void addImageToImageAllFormatsDepthStencilFormatsTests (tcu::TestCaseGroup* group, TestParams params)
{
	const VkImageLayout copySrcLayouts[]		=
	{
		VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
		VK_IMAGE_LAYOUT_GENERAL
	};
	const VkImageLayout copyDstLayouts[]		=
	{
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
		VK_IMAGE_LAYOUT_GENERAL
	};

	for (int srcLayoutNdx = 0u; srcLayoutNdx < DE_LENGTH_OF_ARRAY(copySrcLayouts); ++srcLayoutNdx)
	{
		params.src.image.operationLayout = copySrcLayouts[srcLayoutNdx];
		for (int dstLayoutNdx = 0u; dstLayoutNdx < DE_LENGTH_OF_ARRAY(copyDstLayouts); ++dstLayoutNdx)
		{
			params.dst.image.operationLayout = copyDstLayouts[dstLayoutNdx];

			const std::string testName		= getImageLayoutCaseName(params.src.image.operationLayout) + "_" +
											  getImageLayoutCaseName(params.dst.image.operationLayout);
			const std::string description	= "From layout " + getImageLayoutCaseName(params.src.image.operationLayout) +
											  " to " + getImageLayoutCaseName(params.dst.image.operationLayout);
			group->addChild(new CopyImageToImageTestCase(group->getTestContext(), testName, description, params));
		}
	}
}